

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

char * __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandStringParser::next(CommandStringParser *this)

{
  char cVar1;
  int iVar2;
  long in_RDI;
  char n;
  char t;
  char c;
  char local_12;
  char *local_8;
  
  while (iVar2 = isspace((uint)**(byte **)(in_RDI + 0x30)), iVar2 != 0) {
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  }
  if (**(char **)(in_RDI + 0x30) == '\0') {
    local_8 = (char *)0x0;
  }
  else {
    std::__cxx11::string::clear();
    local_12 = ' ';
    while (cVar1 = **(char **)(in_RDI + 0x30), cVar1 != '\0') {
      if (cVar1 == local_12) {
        if (local_12 == ' ') break;
        local_12 = ' ';
        cVar1 = local_12;
      }
      else if (((cVar1 != '\'') && (cVar1 != '\"')) || (local_12 != ' ')) {
        if (cVar1 == '\\') {
          cVar1 = *(char *)(*(long *)(in_RDI + 0x30) + 1);
          if (((cVar1 == '\"') || (cVar1 == '\'')) || (cVar1 == '\\')) {
            std::__cxx11::string::operator+=((string *)(in_RDI + 0x38),cVar1);
            *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
            cVar1 = local_12;
          }
          else {
            std::__cxx11::string::operator+=((string *)(in_RDI + 0x38),'\\');
            cVar1 = local_12;
          }
        }
        else {
          std::__cxx11::string::operator+=((string *)(in_RDI + 0x38),cVar1);
          cVar1 = local_12;
        }
      }
      local_12 = cVar1;
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    }
    local_8 = (char *)std::__cxx11::string::c_str();
  }
  return local_8;
}

Assistant:

const char* next() {
		// skip leading white
		while (std::isspace(static_cast<unsigned char>(*cmd_))) { ++cmd_; }
		if (!*cmd_) return 0;
		tok_.clear();
		// find end of current arg
		for (char c, t = ' ', n; (c = *cmd_) != 0; ++cmd_) {
			if (c == t) { if (t == ' ') break; t = ' '; }
			else if ((c == '\'' || c == '"') && t == ' ') { t = c; }
			else if (c != '\\') { tok_ += c; }
			else if ((n = cmd_[1]) == '"' || n == '\'' || n == '\\') { tok_ += n; ++cmd_; }
			else { tok_ += c; }
		}
		return tok_.c_str();
	}